

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_forcingstep.c
# Opt level: O0

int forcingStep_AccessARKODEStepMem
              (void *arkode_mem,char *fname,ARKodeMem *ark_mem,ARKodeForcingStepMem *step_mem)

{
  ARKodeForcingStepMem *in_RCX;
  long *in_RDX;
  ARKodeMem in_RSI;
  long in_RDI;
  int local_4;
  
  if (in_RDI == 0) {
    arkProcessError((ARKodeMem)0x0,-0x15,0x33,(char *)in_RSI,
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_forcingstep.c"
                    ,"arkode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else {
    *in_RDX = in_RDI;
    local_4 = forcingStep_AccessStepMem(in_RSI,(char *)in_RDX,in_RCX);
  }
  return local_4;
}

Assistant:

static int forcingStep_AccessARKODEStepMem(void* arkode_mem, const char* fname,
                                           ARKodeMem* ark_mem,
                                           ARKodeForcingStepMem* step_mem)
{
  /* access ARKodeMem structure */
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, fname, __FILE__,
                    MSG_ARK_NO_MEM);
    return ARK_MEM_NULL;
  }
  *ark_mem = (ARKodeMem)arkode_mem;

  return forcingStep_AccessStepMem(*ark_mem, __func__, step_mem);
}